

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseAssertActionCommand<wabt::AssertExceptionCommand>
          (WastParser *this,TokenType token_type,CommandPtr *out_command)

{
  bool bVar1;
  Result RVar2;
  pointer pAVar3;
  unique_ptr<wabt::AssertExceptionCommand,_std::default_delete<wabt::AssertExceptionCommand>_>
  local_38;
  __single_object command;
  CommandPtr *out_command_local;
  TokenType token_type_local;
  WastParser *this_local;
  
  command._M_t.
  super___uniq_ptr_impl<wabt::AssertExceptionCommand,_std::default_delete<wabt::AssertExceptionCommand>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::AssertExceptionCommand_*,_std::default_delete<wabt::AssertExceptionCommand>_>
  .super__Head_base<0UL,_wabt::AssertExceptionCommand_*,_false>._M_head_impl._4_4_ =
       Expect(this,Lpar);
  bVar1 = Failed(command._M_t.
                 super___uniq_ptr_impl<wabt::AssertExceptionCommand,_std::default_delete<wabt::AssertExceptionCommand>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::AssertExceptionCommand_*,_std::default_delete<wabt::AssertExceptionCommand>_>
                 .super__Head_base<0UL,_wabt::AssertExceptionCommand_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    command._M_t.
    super___uniq_ptr_impl<wabt::AssertExceptionCommand,_std::default_delete<wabt::AssertExceptionCommand>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::AssertExceptionCommand_*,_std::default_delete<wabt::AssertExceptionCommand>_>
    .super__Head_base<0UL,_wabt::AssertExceptionCommand_*,_false>._M_head_impl._0_4_ =
         Expect(this,token_type);
    bVar1 = Failed(command._M_t.
                   super___uniq_ptr_impl<wabt::AssertExceptionCommand,_std::default_delete<wabt::AssertExceptionCommand>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::AssertExceptionCommand_*,_std::default_delete<wabt::AssertExceptionCommand>_>
                   .super__Head_base<0UL,_wabt::AssertExceptionCommand_*,_false>._M_head_impl._0_4_)
    ;
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::make_unique<wabt::AssertExceptionCommand>();
      pAVar3 = std::
               unique_ptr<wabt::AssertExceptionCommand,_std::default_delete<wabt::AssertExceptionCommand>_>
               ::operator->(&local_38);
      RVar2 = ParseAction(this,&pAVar3->action);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        RVar2 = Expect(this,Rpar);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                    ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)out_command,
                     &local_38);
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
      std::
      unique_ptr<wabt::AssertExceptionCommand,_std::default_delete<wabt::AssertExceptionCommand>_>::
      ~unique_ptr(&local_38);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseAssertActionCommand(TokenType token_type,
                                            CommandPtr* out_command) {
  WABT_TRACE(ParseAssertActionCommand);
  EXPECT(Lpar);
  CHECK_RESULT(Expect(token_type));
  auto command = std::make_unique<T>();
  CHECK_RESULT(ParseAction(&command->action));
  EXPECT(Rpar);
  *out_command = std::move(command);
  return Result::Ok;
}